

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false>::destroy_range
               (pair<unsigned_long,_llvm::DILineInfo> *S,pair<unsigned_long,_llvm::DILineInfo> *E)

{
  pair<unsigned_long,_llvm::DILineInfo> *local_18;
  pair<unsigned_long,_llvm::DILineInfo> *E_local;
  pair<unsigned_long,_llvm::DILineInfo> *S_local;
  
  local_18 = E;
  while (S != local_18) {
    local_18 = local_18 + -1;
    std::pair<unsigned_long,_llvm::DILineInfo>::~pair(local_18);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }